

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappeablebloomfilter.h
# Opt level: O2

bool __thiscall MappeableBloomFilter<12>::Contain(MappeableBloomFilter<12> *this,uint64_t key)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint64_t uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  uVar4 = MixSplit::operator()(&this->hasher,key);
  uVar5 = uVar4 << 0x20 | uVar4 >> 0x20;
  iVar1 = this->k;
  iVar7 = 0;
  iVar6 = 0;
  if (0 < iVar1) {
    iVar7 = iVar1;
    iVar6 = 0;
  }
  for (; (iVar7 != iVar6 &&
         (auVar2._8_8_ = 0, auVar2._0_8_ = this->arrayLength, auVar3._8_8_ = 0, auVar3._0_8_ = uVar5
         , (this->data[SUB168(auVar2 * auVar3,8)] >> (uVar5 & 0x3f) & 1) != 0));
      uVar5 = uVar5 + uVar4) {
    iVar6 = iVar6 + 1;
  }
  return iVar1 <= iVar6;
}

Assistant:

bool Contain(const uint64_t key) const {
    uint64_t hash = hasher(key);
    uint64_t a = (hash >> 32) | (hash << 32);;
    uint64_t b = hash;
    for (int i = 0; i < k; i++) {
      if ((data[fastrangesize(a, this->arrayLength)] & getBit(a)) == 0) {
        return false;
      }
      a += b;
    }
    return true;
  }